

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O1

void ot::commissioner::persistent_storage::from_json(json *aJson,Network *aValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  const_reference pvVar3;
  JsonException *pJVar4;
  string hexStr;
  uint ret;
  string_t local_c8;
  Error local_a8;
  Error local_80;
  Error local_58;
  
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_ID_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
            (pvVar3,&local_a8.mCode);
  (aValue->mId).mId = local_a8.mCode;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_DOM_REF_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
            (pvVar3,&local_a8.mCode);
  (aValue->mDomainId).mId = local_a8.mCode;
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_NAME_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (pvVar3,&aValue->mName);
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_PAN_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (pvVar3,&local_c8);
  utils::ParseInteger<unsigned_short>(&local_a8,&aValue->mPan,&local_c8);
  EVar2 = local_a8.mCode;
  paVar1 = &local_a8.mMessage.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.mMessage._M_dataplus._M_p);
  }
  if (EVar2 != kNone) {
    pJVar4 = (JsonException *)__cxa_allocate_exception(0x38);
    utils::ParseInteger<unsigned_short>(&local_58,&aValue->mPan,&local_c8);
    anon_unknown_0::JsonException::JsonException(pJVar4,&local_58);
    __cxa_throw(pJVar4,&(anonymous_namespace)::JsonException::typeinfo,
                anon_unknown_0::JsonException::~JsonException);
  }
  pvVar3 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,(key_type *)JSON_XPAN_abi_cxx11_);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (pvVar3,&local_c8);
  utils::ParseInteger<unsigned_long>(&local_a8,&aValue->mXpan,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.mMessage._M_dataplus._M_p);
  }
  if (local_a8.mCode == kNone) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)JSON_CHANNEL_abi_cxx11_);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_int,_0>
              (pvVar3,&aValue->mChannel);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)JSON_MLP_abi_cxx11_);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar3,&aValue->mMlp);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)JSON_CCM_abi_cxx11_);
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
              (pvVar3,&aValue->mCcm);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    return;
  }
  pJVar4 = (JsonException *)__cxa_allocate_exception(0x38);
  utils::ParseInteger<unsigned_long>(&local_80,&aValue->mXpan,&local_c8);
  anon_unknown_0::JsonException::JsonException(pJVar4,&local_80);
  __cxa_throw(pJVar4,&(anonymous_namespace)::JsonException::typeinfo,
              anon_unknown_0::JsonException::~JsonException);
}

Assistant:

void from_json(const json &aJson, Network &aValue)
{
    std::string hexStr;

    aJson.at(JSON_ID).get_to(aValue.mId);
    aJson.at(JSON_DOM_REF).get_to(aValue.mDomainId);
    aJson.at(JSON_NAME).get_to(aValue.mName);

    aJson.at(JSON_PAN).get_to(hexStr);
    SuccessOrThrow(utils::ParseInteger(aValue.mPan, hexStr));
    aJson.at(JSON_XPAN).get_to(hexStr);
    SuccessOrThrow(utils::ParseInteger(aValue.mXpan, hexStr));

    aJson.at(JSON_CHANNEL).get_to(aValue.mChannel);
    aJson.at(JSON_MLP).get_to(aValue.mMlp);
    aJson.at(JSON_CCM).get_to(aValue.mCcm);
}